

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.cpp
# Opt level: O3

ChClassFactory * chrono::ChClassFactory::GetGlobalClassFactory(void)

{
  ChClassFactory *pCVar1;
  
  if (GetGlobalClassFactory::mfactory != (ChClassFactory *)0x0) {
    return GetGlobalClassFactory::mfactory;
  }
  pCVar1 = (ChClassFactory *)::operator_new(0x70);
  GetGlobalClassFactory::mfactory = pCVar1;
  (pCVar1->class_map)._M_h._M_buckets = &(pCVar1->class_map)._M_h._M_single_bucket;
  (pCVar1->class_map)._M_h._M_bucket_count = 1;
  (pCVar1->class_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pCVar1->class_map)._M_h._M_element_count = 0;
  (pCVar1->class_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pCVar1->class_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (pCVar1->class_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pCVar1->class_map_typeids)._M_h._M_buckets = &(pCVar1->class_map_typeids)._M_h._M_single_bucket;
  (pCVar1->class_map_typeids)._M_h._M_bucket_count = 1;
  (pCVar1->class_map_typeids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pCVar1->class_map_typeids)._M_h._M_element_count = 0;
  (pCVar1->class_map_typeids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pCVar1->class_map_typeids)._M_h._M_rehash_policy._M_next_resize = 0;
  (pCVar1->class_map_typeids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return pCVar1;
}

Assistant:

ChClassFactory* ChClassFactory::GetGlobalClassFactory() {
    static ChClassFactory* mfactory = 0;
    if (!mfactory)
        mfactory = new ChClassFactory;
    return mfactory;
}